

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O0

void anon_unknown.dwarf_1412e7::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<half_*> *halfData,int x1,int x2,int y1,int y2)

{
  uint **ppuVar1;
  float **ppfVar2;
  half **pphVar3;
  Array2D<half_*> *in_RCX;
  Array2D<float_*> *in_RDX;
  Array2D<unsigned_int_*> *in_RSI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int x;
  int y;
  int local_30;
  int local_2c;
  
  for (local_2c = in_stack_00000008; local_30 = in_R8D, local_2c <= in_stack_00000010;
      local_2c = local_2c + 1) {
    for (; local_30 <= in_R9D; local_30 = local_30 + 1) {
      if (in_EDI == 0) {
        ppuVar1 = Imf_2_5::Array2D<unsigned_int_*>::operator[](in_RSI,(long)local_2c);
        if (ppuVar1[local_30] != (uint *)0x0) {
          operator_delete__(ppuVar1[local_30]);
        }
      }
      if (in_EDI == 1) {
        ppfVar2 = Imf_2_5::Array2D<float_*>::operator[](in_RDX,(long)local_2c);
        if (ppfVar2[local_30] != (float *)0x0) {
          operator_delete__(ppfVar2[local_30]);
        }
      }
      if (in_EDI == 2) {
        pphVar3 = Imf_2_5::Array2D<half_*>::operator[](in_RCX,(long)local_2c);
        if (pphVar3[local_30] != (half *)0x0) {
          operator_delete__(pphVar3[local_30]);
        }
      }
    }
  }
  return;
}

Assistant:

void
releasePixels (int type,
               Array2D<unsigned int*>& uintData,
               Array2D<float*>& floatData,
               Array2D<half*>& halfData,
               int x1, int x2, int y1, int y2)
{
    for (int y = y1; y <= y2; y++)
    {
        for (int x = x1; x <= x2; x++)
        {
            if (type == 0)
                delete[] uintData[y][x];
            if (type == 1)
                delete[] floatData[y][x];
            if (type == 2)
                delete[] halfData[y][x];
        }
    }
}